

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InprocComms.cpp
# Opt level: O3

void __thiscall helics::inproc::InprocComms::queue_tx_function(InprocComms *this)

{
  _Rb_tree_color _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined4 uVar3;
  pointer *ppAVar4;
  _Base_ptr p_Var5;
  bool bVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  int *piVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  char *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  ActionMessage *command;
  _Base_ptr p_Var16;
  ActionMessage *command_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var18;
  pointer pcVar19;
  undefined8 uVar20;
  BrokerBase *this_00;
  _Alloc_hider _Var22;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  long lVar23;
  undefined1 auVar24 [8];
  BrokerBase *this_01;
  shared_ptr<helics::Broker> sVar25;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>,_std::_Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
  pVar26;
  string_view brokerName;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view configureString;
  string_view configureString_00;
  string_view copyToName;
  string_view copyToName_00;
  string_view fmt;
  format_args args;
  string_view copyFromName;
  string_view copyFromName_00;
  string_view brokerName_00;
  string_view name;
  string_view brokerName_01;
  shared_ptr<helics::CommonCore> tcore;
  shared_ptr<helics::Broker> brk;
  shared_ptr<helics::Core> core;
  map<helics::route_id,_std::shared_ptr<helics::BrokerBase>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
  routes;
  shared_ptr<helics::Broker> broker;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *local_210;
  undefined1 local_208 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [11];
  long local_140;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  BrokerBase *local_120;
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
  local_118;
  _Any_data local_e8;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  pointer pAStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  long lStack_68;
  undefined8 local_60;
  pointer *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  size_t sVar15;
  size_t sVar21;
  
  sVar21 = (this->super_CommsInterface).name._M_string_length;
  sVar15 = (this->super_CommsInterface).localTargetAddress._M_string_length;
  if ((sVar21 != sVar15) ||
     ((sVar21 != 0 &&
      (iVar8 = bcmp((this->super_CommsInterface).name._M_dataplus._M_p,
                    (this->super_CommsInterface).localTargetAddress._M_dataplus._M_p,sVar21),
      iVar8 != 0)))) {
    pcVar19 = (this->super_CommsInterface).name._M_dataplus._M_p;
    in_RCX = (this->super_CommsInterface).localTargetAddress._M_dataplus._M_p;
    if ((this->super_CommsInterface).brokerName._M_string_length != 0) {
      copyToName._M_str = in_RCX;
      copyToName._M_len = sVar15;
      copyFromName._M_str = pcVar19;
      copyFromName._M_len = sVar21;
      bVar6 = CoreFactory::copyCoreIdentifier(copyFromName,copyToName);
      if (bVar6) goto LAB_002b1408;
      pcVar19 = (this->super_CommsInterface).name._M_dataplus._M_p;
      sVar21 = (this->super_CommsInterface).name._M_string_length;
      in_RCX = (this->super_CommsInterface).localTargetAddress._M_dataplus._M_p;
      sVar15 = (this->super_CommsInterface).localTargetAddress._M_string_length;
    }
    copyToName_00._M_str = in_RCX;
    copyToName_00._M_len = sVar15;
    copyFromName_00._M_str = pcVar19;
    copyFromName_00._M_len = sVar21;
    bVar6 = BrokerFactory::copyBrokerIdentifier(copyFromName_00,copyToName_00);
    if (!bVar6) {
      CommsInterface::setRxStatus(&this->super_CommsInterface,ERRORED);
      CommsInterface::setTxStatus(&this->super_CommsInterface,ERRORED);
      return;
    }
  }
LAB_002b1408:
  iVar8 = 0;
  CommsInterface::setRxStatus(&this->super_CommsInterface,CONNECTED);
  local_218 = &(this->super_CommsInterface).brokerName;
  if (((this->super_CommsInterface).brokerName._M_string_length == 0) &&
     (((this->super_CommsInterface).brokerTargetAddress._M_string_length == 0 ||
      (std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                 (local_218,&(this->super_CommsInterface).brokerTargetAddress),
      (this->super_CommsInterface).brokerName._M_string_length == 0)))) {
    if ((this->super_CommsInterface).serverMode != false) {
      local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      auVar24 = (undefined1  [8])0x0;
      local_270 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      goto LAB_002b1843;
    }
    local_270 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar23 = 0;
    do {
      BrokerFactory::findJoinableBrokerOfType((CoreType)&local_e8);
      if (local_e8._M_unused._M_object == (void *)0x0) {
        _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        auVar24 = (undefined1  [8])
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      }
      else {
        in_RCX = (char *)0x0;
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__dynamic_cast(local_e8._M_unused._M_object,&Broker::typeinfo,
                                    &CoreBroker::typeinfo,0);
        _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        auVar24 = (undefined1  [8])
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
        if (paVar10 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          auVar24 = (undefined1  [8])paVar10;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            in_RCX = &__libc_single_threaded;
            _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_;
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_e8._8_8_ + 8) = *(_Atomic_word *)(local_e8._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_e8._8_8_ + 8) = *(_Atomic_word *)(local_e8._8_8_ + 8) + 1;
            }
          }
        }
      }
      if (local_270 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_270);
      }
      local_270 = _Var18._M_pi;
      if (auVar24 == (undefined1  [8])0x0) {
        if ((this->super_CommsInterface).autoBroker == true) {
          in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                  (this->super_CommsInterface).brokerInitString._M_dataplus._M_p;
          iVar8 = 0x12;
          configureString_00._M_str =
               (char *)(this->super_CommsInterface).brokerInitString._M_string_length;
          configureString_00._M_len = (size_t)"";
          in_RCX = "";
          sVar25 = BrokerFactory::create
                             ((CoreType)(timespec *)local_208,(string_view)ZEXT816(0x12),
                              configureString_00);
          auVar24 = local_208;
          _Var17 = sVar25.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          local_270 = _Stack_200._M_pi;
          local_208 = (undefined1  [8])0x0;
          _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if ((_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var18._M_pi),
             _Var17._M_pi = extraout_RDX_01,
             _Stack_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_200._M_pi);
            _Var17._M_pi = extraout_RDX_02;
          }
          CoreBroker::connect((CoreBroker *)auVar24,iVar8,(sockaddr *)_Var17._M_pi,(socklen_t)in_RCX
                             );
        }
        else {
          if ((this->super_CommsInterface).connectionTimeout.__r < lVar23) {
            CommsInterface::setTxStatus(&this->super_CommsInterface,ERRORED);
            CommsInterface::setRxStatus(&this->super_CommsInterface,ERRORED);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
            }
            goto LAB_002b175b;
          }
          local_208 = (undefined1  [8])0x0;
          _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xbebc200;
          do {
            iVar8 = nanosleep((timespec *)local_208,(timespec *)local_208);
            if (iVar8 != -1) break;
            piVar11 = __errno_location();
          } while (*piVar11 == 4);
          lVar23 = lVar23 + 200;
          auVar24 = (undefined1  [8])0x0;
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
      }
    } while (auVar24 == (undefined1  [8])0x0);
  }
  else {
    local_210 = (BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
                 *)0x0;
    auVar24 = (undefined1  [8])0x0;
    local_270 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    while (auVar24 == (undefined1  [8])0x0) {
      brokerName_00._M_str = (char *)(this->super_CommsInterface).brokerName._M_string_length;
      brokerName_00._M_len = (size_t)&local_e8;
      BrokerFactory::findBroker(brokerName_00);
      if (local_e8._M_unused._M_object == (void *)0x0) {
        _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        auVar24 = (undefined1  [8])
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      }
      else {
        in_RCX = (char *)0x0;
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__dynamic_cast(local_e8._M_unused._M_object,&Broker::typeinfo,
                                    &CoreBroker::typeinfo,0);
        _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        auVar24 = (undefined1  [8])
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
        if (paVar10 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          auVar24 = (undefined1  [8])paVar10;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            in_RCX = &__libc_single_threaded;
            _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_;
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_e8._8_8_ + 8) = *(_Atomic_word *)(local_e8._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_e8._8_8_ + 8) = *(_Atomic_word *)(local_e8._8_8_ + 8) + 1;
            }
          }
        }
      }
      if (local_270 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_270);
      }
      if (auVar24 == (undefined1  [8])0x0) {
        if ((this->super_CommsInterface).autoBroker == true) {
          in_RCX = (this->super_CommsInterface).brokerName._M_dataplus._M_p;
          in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                  (this->super_CommsInterface).brokerInitString._M_dataplus._M_p;
          brokerName._M_str = (char *)(this->super_CommsInterface).brokerName._M_string_length;
          brokerName._M_len = 0x12;
          iVar9 = 0x12;
          configureString._M_str =
               (char *)(this->super_CommsInterface).brokerInitString._M_string_length;
          configureString._M_len = (size_t)in_RCX;
          sVar25 = BrokerFactory::create
                             ((CoreType)
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_208,brokerName,configureString);
          _Var17._M_pi = _Stack_200._M_pi;
          auVar24 = local_208;
          __addr = sVar25.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          local_208 = (undefined1  [8])0x0;
          _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if ((_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var18._M_pi),
             __addr._M_pi = extraout_RDX,
             _Stack_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_200._M_pi);
            __addr._M_pi = extraout_RDX_00;
          }
          bVar6 = true;
          CoreBroker::connect((CoreBroker *)auVar24,iVar9,(sockaddr *)__addr._M_pi,(socklen_t)in_RCX
                             );
          _Var18._M_pi = _Var17._M_pi;
        }
        else if ((this->super_CommsInterface).connectionTimeout.__r < (long)local_210) {
          CommsInterface::setTxStatus(&this->super_CommsInterface,ERRORED);
          CommsInterface::setRxStatus(&this->super_CommsInterface,ERRORED);
          auVar24 = (undefined1  [8])0x0;
          bVar6 = false;
        }
        else {
          local_208 = (undefined1  [8])0x0;
          _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xbebc200;
          do {
            iVar9 = nanosleep((timespec *)local_208,(timespec *)local_208);
            if (iVar9 != -1) break;
            piVar11 = __errno_location();
          } while (*piVar11 == 4);
          local_210 = (BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
                       *)((long)local_210 + 200);
          bVar6 = true;
          auVar24 = (undefined1  [8])0x0;
        }
      }
      else {
        cVar7 = (**(code **)(*(size_type *)auVar24 + 0x38))(auVar24);
        bVar6 = true;
        if ((cVar7 == '\0') && ((this->super_CommsInterface).observer == false)) {
          if (iVar8 == 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_208,"broker is not open to new federates ",local_218);
            message._M_str = (char *)local_208;
            message._M_len = (size_t)_Stack_200._M_pi;
            CommsInterface::logError(&this->super_CommsInterface,message);
            if (local_208 != (undefined1  [8])local_1f8) {
              operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
            }
          }
          if (_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var18._M_pi);
          }
          uVar20 = local_e8._8_8_;
          local_e8._M_unused._M_object = (void *)0x0;
          local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar20 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar20);
          }
          iVar9 = iVar8 + 1;
          if (iVar8 < 2) {
            if (iVar8 == 0) {
              local_208 = (undefined1  [8])0x0;
              _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xbebc200;
              do {
                iVar8 = nanosleep((timespec *)local_208,(timespec *)local_208);
                if (iVar8 != -1) break;
                piVar11 = __errno_location();
              } while (*piVar11 == 4);
            }
            BrokerFactory::cleanUpBrokers((milliseconds)0xc8);
            in_RCX = (char *)((long)local_210 + 200);
            local_210 = (BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
                         *)in_RCX;
            if ((this->super_CommsInterface).connectionTimeout.__r < (long)in_RCX) {
              CommsInterface::setTxStatus(&this->super_CommsInterface,ERRORED);
              CommsInterface::setRxStatus(&this->super_CommsInterface,ERRORED);
              auVar24 = (undefined1  [8])0x0;
              bVar6 = false;
              _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              iVar8 = iVar9;
            }
            else {
              auVar24 = (undefined1  [8])0x0;
              _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              iVar8 = iVar9;
            }
          }
          else {
            CommsInterface::setTxStatus(&this->super_CommsInterface,ERRORED);
            CommsInterface::setRxStatus(&this->super_CommsInterface,ERRORED);
            auVar24 = (undefined1  [8])0x0;
            bVar6 = false;
            _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            iVar8 = iVar9;
          }
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
      }
      local_270 = _Var18._M_pi;
      if (!bVar6) {
LAB_002b175b:
        if (_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var18._M_pi);
        }
        return;
      }
    }
  }
  sVar21 = *(long *)((long)auVar24 + 0x78);
  if ((sVar21 == (this->super_CommsInterface).localTargetAddress._M_string_length) &&
     ((sVar21 == 0 ||
      (iVar8 = bcmp(*(void **)((long)auVar24 + 0x70),
                    (this->super_CommsInterface).localTargetAddress._M_dataplus._M_p,sVar21),
      iVar8 == 0)))) {
    message_00._M_str = "broker == target";
    message_00._M_len = 0x10;
    CommsInterface::logError(&this->super_CommsInterface,message_00);
  }
  cVar7 = (**(code **)(*(size_type *)auVar24 + 0x38))(auVar24);
  local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT71((int7)((ulong)in_RCX >> 8),1);
  if ((cVar7 == '\0') && ((this->super_CommsInterface).observer == false)) {
    message_01._M_str = "broker is not open to new federates";
    message_01._M_len = 0x23;
    CommsInterface::logError(&this->super_CommsInterface,message_01);
  }
LAB_002b1843:
  CommsInterface::setTxStatus(&this->super_CommsInterface,CONNECTED);
  local_118._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118._M_impl.super__Rb_tree_header._M_header;
  local_118._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_210 = &(this->super_CommsInterface).txQueue;
  this_01 = (BrokerBase *)((long)auVar24 + 8);
  local_120 = this_01;
  local_118._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    local_e8._M_unused._M_object = (void *)0x0;
    local_e8._8_8_ = 0x9aac0f0000000000;
    local_d8 = 0x9aac0f0000000000;
    local_70 = 0;
    lStack_68 = 0;
    local_80 = 0;
    uStack_78 = 0;
    local_90 = 0;
    uStack_88 = 0;
    local_a0 = 0;
    uStack_98 = 0;
    local_b0 = 0;
    pAStack_a8 = (pointer)0x0;
    local_c0 = 0;
    uStack_b8 = 0;
    local_d0 = 0;
    uStack_c8 = 0;
    local_60 = 0x40;
    local_58 = &pAStack_a8;
    local_40 = 0;
    uStack_38 = 0;
    local_50 = 0;
    uStack_48 = 0;
    gmlc::containers::
    BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
    ::pop((pair<helics::route_id,_helics::ActionMessage> *)local_208,local_210);
    uVar3 = local_208._0_4_;
    ActionMessage::operator=((ActionMessage *)&local_e8,(ActionMessage *)&_Stack_200);
    ActionMessage::~ActionMessage((ActionMessage *)&_Stack_200);
    ppAVar4 = local_58;
    if (((local_e8._0_4_ == -60000) || (local_e8._0_4_ == 0x1000ea60)) || (local_e8._0_4_ == 60000))
    {
      if (uVar3 == 0) goto LAB_002b1aae;
      if (uVar3 != -1) {
LAB_002b19b1:
        if (local_118._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var13 = &local_118._M_impl.super__Rb_tree_header._M_header;
          p_Var5 = local_118._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            p_Var16 = p_Var5;
            p_Var12 = p_Var13;
            _Var1 = p_Var16[1]._M_color;
            p_Var13 = p_Var16;
            if ((int)_Var1 < (int)uVar3) {
              p_Var13 = p_Var12;
            }
            p_Var5 = (&p_Var16->_M_left)[(int)_Var1 < (int)uVar3];
          } while ((&p_Var16->_M_left)[(int)_Var1 < (int)uVar3] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var13 == &local_118._M_impl.super__Rb_tree_header)
          goto LAB_002b1a04;
          if ((int)_Var1 < (int)uVar3) {
            p_Var16 = p_Var12;
          }
          if ((int)uVar3 < (int)p_Var16[1]._M_color) goto LAB_002b1a04;
          this_00 = (BrokerBase *)p_Var13[1]._M_parent;
LAB_002b1b56:
          BrokerBase::addActionMessage(this_00,(ActionMessage *)&local_e8);
          goto LAB_002b1d08;
        }
LAB_002b1a04:
        this_00 = this_01;
        if ((char)local_218 != '\0') goto LAB_002b1b56;
        bVar6 = isIgnoreableCommand((ActionMessage *)&local_e8);
        if (bVar6) goto LAB_002b1d08;
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_258,"unknown route, message dropped ","");
        prettyPrintString_abi_cxx11_(&local_238,(helics *)local_e8._M_pod_data,command_00);
        uVar20 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          uVar20 = local_258.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar20 < local_238._M_string_length + local_258._M_string_length) {
          in_R9.values_ = (value<fmt::v11::context> *)&local_238.field_2;
          uVar20 = 0xf;
          if ((value<fmt::v11::context> *)local_238._M_dataplus._M_p != in_R9.values_) {
            uVar20 = local_238.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar20 < local_238._M_string_length + local_258._M_string_length)
          goto LAB_002b1a9f;
          pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace(&local_238,0,0,local_258._M_dataplus._M_p,local_258._M_string_length);
        }
        else {
LAB_002b1a9f:
          pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append(&local_258,local_238._M_dataplus._M_p,local_238._M_string_length);
        }
        local_208 = (undefined1  [8])local_1f8;
        paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar14->_M_dataplus)._M_p;
        paVar10 = &pbVar14->field_2;
        if (paVar2 == paVar10) {
          local_1f8[0]._0_8_ = paVar10->_M_allocated_capacity;
          local_1f8[0]._8_8_ = *(undefined8 *)((long)&pbVar14->field_2 + 8);
        }
        else {
          local_1f8[0]._0_8_ = paVar10->_M_allocated_capacity;
          local_208 = (undefined1  [8])paVar2;
        }
        _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar14->_M_string_length
        ;
        (pbVar14->_M_dataplus)._M_p = (pointer)paVar10;
        pbVar14->_M_string_length = 0;
        paVar10->_M_local_buf[0] = '\0';
        message_03._M_str = (char *)local_208;
        message_03._M_len = (size_t)_Stack_200._M_pi;
        CommsInterface::logWarning(&this->super_CommsInterface,message_03);
        if (local_208 != (undefined1  [8])local_1f8) {
          operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
        }
        uVar20 = local_238.field_2._M_allocated_capacity;
        _Var22._M_p = local_238._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) goto LAB_002b1ce4;
        goto LAB_002b1cec;
      }
      if ((int)local_e8._4_4_ < 0x9db) {
        if (local_e8._4_4_ == 0xe9) {
          lVar23 = (long)local_58 + lStack_68;
          local_208 = (undefined1  [8])local_1f8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_208,local_58,lVar23);
          name._M_str = (char *)_Stack_200._M_pi;
          name._M_len = (size_t)&local_130;
          CoreFactory::findCore(name);
          if (local_208 != (undefined1  [8])local_1f8) {
            operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
          }
          if (local_130 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            bVar6 = false;
          }
          else {
            local_208 = (undefined1  [8])
                        __dynamic_cast(local_130,&Core::typeinfo,&CommonCore::typeinfo,0);
            if (local_208 == (undefined1  [8])0x0) {
              local_208 = (undefined1  [8])0x0;
              _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_002b1d27:
              bVar6 = false;
            }
            else {
              _Stack_200._M_pi = local_128;
              if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  local_128->_M_use_count = local_128->_M_use_count + 1;
                  UNLOCK();
                  if (local_208 == (undefined1  [8])0x0) goto LAB_002b1d27;
                }
                else {
                  local_128->_M_use_count = local_128->_M_use_count + 1;
                }
              }
              local_258._M_dataplus._M_p._0_4_ = local_d8._4_4_;
              std::
              _Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>>
              ::_M_emplace_unique<helics::route_id,std::shared_ptr<helics::CommonCore>>
                        ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>>
                          *)&local_118,(route_id *)&local_258,
                         (shared_ptr<helics::CommonCore> *)local_208);
              bVar6 = true;
            }
            if (_Stack_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_200._M_pi);
            }
          }
          local_208 = (undefined1  [8])local_1f8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_208,ppAVar4,lVar23);
          brokerName_01._M_str = (char *)_Stack_200._M_pi;
          brokerName_01._M_len = (size_t)&local_140;
          BrokerFactory::findBroker(brokerName_01);
          if (local_208 != (undefined1  [8])local_1f8) {
            operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
          }
          if (local_140 != 0) {
            local_208 = (undefined1  [8])
                        __dynamic_cast(local_140,&Broker::typeinfo,&CoreBroker::typeinfo,0);
            if (local_208 == (undefined1  [8])0x0) {
              local_208 = (undefined1  [8])0x0;
              _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            else {
              _Stack_200._M_pi = local_138;
              if (local_138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  local_138->_M_use_count = local_138->_M_use_count + 1;
                  UNLOCK();
                  if (local_208 == (undefined1  [8])0x0) goto LAB_002b1e51;
                }
                else {
                  local_138->_M_use_count = local_138->_M_use_count + 1;
                }
              }
              local_258._M_dataplus._M_p._0_4_ = local_d8._4_4_;
              std::
              _Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>>
              ::_M_emplace_unique<helics::route_id,std::shared_ptr<helics::CoreBroker>>
                        ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>>
                          *)&local_118,(route_id *)&local_258,
                         (shared_ptr<helics::CoreBroker> *)local_208);
              bVar6 = true;
            }
LAB_002b1e51:
            if (_Stack_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_200._M_pi);
            }
          }
          if (!bVar6) {
            local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_258,"unable to establish Route to ","");
            local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,ppAVar4,lVar23);
            uVar20 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != &local_258.field_2) {
              uVar20 = local_258.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar20 < local_238._M_string_length + local_258._M_string_length) {
              in_R9.values_ = (value<fmt::v11::context> *)&local_238.field_2;
              uVar20 = 0xf;
              if ((value<fmt::v11::context> *)local_238._M_dataplus._M_p != in_R9.values_) {
                uVar20 = local_238.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar20 < local_238._M_string_length + local_258._M_string_length)
              goto LAB_002b1ef9;
              pbVar14 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                  (&local_238,0,0,local_258._M_dataplus._M_p,
                                   local_258._M_string_length);
            }
            else {
LAB_002b1ef9:
              pbVar14 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                  (&local_258,local_238._M_dataplus._M_p,local_238._M_string_length)
              ;
            }
            local_208 = (undefined1  [8])(pbVar14->_M_dataplus)._M_p;
            paVar10 = &pbVar14->field_2;
            if (local_208 == (undefined1  [8])paVar10) {
              local_1f8[0]._0_8_ = paVar10->_M_allocated_capacity;
              local_1f8[0]._8_8_ = *(undefined8 *)((long)&pbVar14->field_2 + 8);
              local_208 = (undefined1  [8])local_1f8;
            }
            else {
              local_1f8[0]._0_8_ = paVar10->_M_allocated_capacity;
            }
            _Stack_200._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar14->_M_string_length;
            (pbVar14->_M_dataplus)._M_p = (pointer)paVar10;
            pbVar14->_M_string_length = 0;
            paVar10->_M_local_buf[0] = '\0';
            message_04._M_str = (char *)local_208;
            message_04._M_len = (size_t)_Stack_200._M_pi;
            CommsInterface::logError(&this->super_CommsInterface,message_04);
            if (local_208 != (undefined1  [8])local_1f8) {
              operator_delete((void *)local_208,local_1f8[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
              operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != &local_258.field_2) {
              operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (local_138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138);
          }
          this_01 = local_120;
          if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
          }
        }
        else {
          if (local_e8._4_4_ != 0xf4) goto LAB_002b19b1;
          local_208._0_4_ = local_d8._4_4_;
          pVar26 = std::
                   _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
                   ::equal_range(&local_118,(key_type *)local_208);
          std::
          _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
          ::_M_erase_aux(&local_118,(_Base_ptr)pVar26.first._M_node,(_Base_ptr)pVar26.second._M_node
                        );
        }
      }
      else {
        if (local_e8._4_4_ != 0x16570bf) {
          if (local_e8._4_4_ == 0x9db) {
            ActionMessage::~ActionMessage((ActionMessage *)&local_e8);
            std::
            _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
            ::clear(&local_118);
            if (local_270 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_270);
            }
            CommsInterface::setTxStatus(&this->super_CommsInterface,TERMINATED);
            std::
            _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
            ::~_Rb_tree(&local_118);
            return;
          }
          goto LAB_002b19b1;
        }
        CommsInterface::setRxStatus(&this->super_CommsInterface,TERMINATED);
      }
    }
    else {
      if (uVar3 != 0) goto LAB_002b19b1;
LAB_002b1aae:
      if ((char)local_218 == '\0') {
        prettyPrintString_abi_cxx11_(&local_258,(helics *)local_e8._M_pod_data,command);
        local_238._M_dataplus._M_p = local_258._M_dataplus._M_p;
        local_238._M_string_length = local_258._M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x4c;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_238;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)local_208,
                   (v11 *)
                   "message directed to broker of comm system with no broker, message dropped {}",
                   fmt,args);
        message_02._M_str = (char *)local_208;
        message_02._M_len = (size_t)_Stack_200._M_pi;
        CommsInterface::logWarning(&this->super_CommsInterface,message_02);
        uVar20 = local_1f8[0]._M_allocated_capacity;
        _Var22._M_p = (pointer)local_208;
        if (local_208 != (undefined1  [8])local_1f8) {
LAB_002b1ce4:
          operator_delete(_Var22._M_p,uVar20 + 1);
        }
LAB_002b1cec:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        BrokerBase::addActionMessage(this_01,(ActionMessage *)&local_e8);
      }
    }
LAB_002b1d08:
    ActionMessage::~ActionMessage((ActionMessage *)&local_e8);
  } while( true );
}

Assistant:

void InprocComms::queue_tx_function()
    {
        using std::chrono::milliseconds;
        // make sure the link to the localTargetAddress is in place
        if (name != localTargetAddress) {
            if (!brokerName.empty()) {
                if (!CoreFactory::copyCoreIdentifier(name, localTargetAddress)) {
                    if (!BrokerFactory::copyBrokerIdentifier(name, localTargetAddress)) {
                        setRxStatus(ConnectionStatus::ERRORED);
                        setTxStatus(ConnectionStatus::ERRORED);
                        return;
                    }
                }
            } else {
                if (!BrokerFactory::copyBrokerIdentifier(name, localTargetAddress)) {
                    setRxStatus(ConnectionStatus::ERRORED);
                    setTxStatus(ConnectionStatus::ERRORED);
                    return;
                }
            }
        }
        setRxStatus(ConnectionStatus::CONNECTED);
        std::shared_ptr<CoreBroker> tbroker;

        if (brokerName.empty()) {
            if (!brokerTargetAddress.empty()) {
                brokerName = brokerTargetAddress;
            }
        }

        if (!brokerName.empty()) {
            milliseconds totalSleep(0);
            int ecount{0};
            while (!tbroker) {
                auto broker = BrokerFactory::findBroker(brokerName);
                tbroker = std::dynamic_pointer_cast<CoreBroker>(broker);
                if (!tbroker) {
                    if (autoBroker) {
                        tbroker = std::static_pointer_cast<CoreBroker>(
                            BrokerFactory::create(CoreType::INPROC, brokerName, brokerInitString));
                        tbroker->connect();
                    } else {
                        if (totalSleep > connectionTimeout) {
                            setTxStatus(ConnectionStatus::ERRORED);
                            setRxStatus(ConnectionStatus::ERRORED);
                            return;
                        }
                        std::this_thread::sleep_for(milliseconds(200));
                        totalSleep += milliseconds(200);
                    }
                } else {
                    if (!tbroker->isOpenToNewFederates() && !observer) {
                        ++ecount;
                        if (ecount == 1) {
                            logError("broker is not open to new federates " + brokerName);
                        }
                        tbroker = nullptr;
                        broker = nullptr;
                        if (ecount >= 3) {
                            setTxStatus(ConnectionStatus::ERRORED);
                            setRxStatus(ConnectionStatus::ERRORED);
                            return;
                        }
                        if (ecount == 1) {
                            std::this_thread::sleep_for(milliseconds(200));
                        }
                        BrokerFactory::cleanUpBrokers(milliseconds(200));
                        totalSleep += milliseconds(200);
                        if (totalSleep > milliseconds(connectionTimeout)) {
                            setTxStatus(ConnectionStatus::ERRORED);
                            setRxStatus(ConnectionStatus::ERRORED);
                            return;
                        }
                    }
                }
            }
        } else if (!serverMode) {
            milliseconds totalSleep(0);
            while (!tbroker) {
                auto broker = BrokerFactory::findJoinableBrokerOfType(CoreType::INPROC);
                tbroker = std::dynamic_pointer_cast<CoreBroker>(broker);
                if (!tbroker) {
                    if (autoBroker) {
                        tbroker = std::static_pointer_cast<CoreBroker>(
                            BrokerFactory::create(CoreType::INPROC, "", brokerInitString));
                        tbroker->connect();
                    } else {
                        if (totalSleep > connectionTimeout) {
                            setTxStatus(ConnectionStatus::ERRORED);
                            setRxStatus(ConnectionStatus::ERRORED);
                            return;
                        }
                        std::this_thread::sleep_for(milliseconds(200));
                        totalSleep += milliseconds(200);
                    }
                }
            }
        }
        if (tbroker) {
            if (tbroker->getIdentifier() == localTargetAddress) {
                logError("broker == target");
            }
            if (!tbroker->isOpenToNewFederates() && !observer) {
                logError("broker is not open to new federates");
            }
        }

        setTxStatus(ConnectionStatus::CONNECTED);
        std::map<route_id, std::shared_ptr<BrokerBase>> routes;
        bool haltLoop{false};
        while (!haltLoop) {
            route_id rid;
            ActionMessage cmd;

            std::tie(rid, cmd) = txQueue.pop();
            bool processed = false;
            if (isProtocolCommand(cmd)) {
                if (rid == control_route) {
                    switch (cmd.messageID) {
                        case NEW_ROUTE: {
                            auto newroute = cmd.payload.to_string();
                            bool foundRoute = false;
                            auto core = CoreFactory::findCore(std::string(newroute));
                            if (core) {
                                auto tcore = std::dynamic_pointer_cast<CommonCore>(core);
                                if (tcore) {
                                    routes.emplace(route_id{cmd.getExtraData()}, std::move(tcore));
                                    foundRoute = true;
                                }
                            }
                            auto brk = BrokerFactory::findBroker(std::string(newroute));

                            if (brk) {
                                auto cbrk = std::dynamic_pointer_cast<CoreBroker>(brk);
                                if (cbrk) {
                                    routes.emplace(route_id{cmd.getExtraData()}, std::move(cbrk));
                                    foundRoute = true;
                                }
                            }
                            if (!foundRoute) {
                                logError(std::string("unable to establish Route to ") +
                                         std::string(newroute));
                            }
                            processed = true;
                        } break;
                        case REMOVE_ROUTE:
                            routes.erase(route_id{cmd.getExtraData()});
                            processed = true;
                            break;
                        case CLOSE_RECEIVER:
                            setRxStatus(ConnectionStatus::TERMINATED);
                            processed = true;
                            break;
                        case DISCONNECT:
                            haltLoop = true;
                            continue;
                    }
                }
            }
            if (processed) {
                continue;
            }

            if (rid == parent_route_id) {
                if (tbroker) {
                    tbroker->addActionMessage(std::move(cmd));
                } else {
                    logWarning(fmt::format(
                        "message directed to broker of comm system with no broker, message dropped {}",
                        prettyPrintString(cmd)));
                }
            } else {
                auto rt_find = routes.find(rid);
                if (rt_find != routes.end()) {
                    rt_find->second->addActionMessage(std::move(cmd));
                } else {
                    if (tbroker) {
                        tbroker->addActionMessage(std::move(cmd));
                    } else {
                        if (!isIgnoreableCommand(cmd)) {
                            logWarning(std::string("unknown route, message dropped ") +
                                       prettyPrintString(cmd));
                        }
                    }
                }
            }
        }  // while (!haltLoop)

        routes.clear();
        tbroker = nullptr;

        setTxStatus(ConnectionStatus::TERMINATED);
    }